

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_utils.cpp
# Opt level: O0

void amrex::apply_eb_redistribution
               (Box *bx,MultiFab *div_mf,MultiFab *divc_mf,MultiFab *weights,MFIter *mfi,int icomp,
               int ncomp,EBCellFlagFab *flags_fab,MultiFab *volfrac,Box *param_10,Geometry *geom)

{
  bool bVar1;
  int __x;
  double extraout_XMM0_Qa;
  double dVar2;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  long in_stack_00000010;
  CoordSys *in_stack_00000028;
  Array4<const_double> *vfrac;
  int in_stack_00000130;
  int in_stack_00000134;
  Array4<const_double> *in_stack_00000138;
  Array4<const_double> *in_stack_00000140;
  Array4<double> *in_stack_00000148;
  Box *in_stack_00000150;
  Array4<const_amrex::EBCellFlag> *flags;
  Array4<const_double> *wt;
  Array4<double> *divc;
  Array4<double> *div;
  Real *dx;
  Array4<const_amrex::EBCellFlag> *in_stack_00000b40;
  Array4<const_double> *in_stack_00000b48;
  Geometry *in_stack_00000b50;
  MFIter *in_stack_fffffffffffffc40;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffc48;
  char *in_stack_fffffffffffffc50;
  undefined1 *puVar3;
  Array4<const_double> local_328;
  undefined1 local_2e8 [64];
  undefined1 *local_2a8;
  Array4<const_amrex::EBCellFlag> local_2a0;
  Array4<const_amrex::EBCellFlag> *local_260;
  undefined1 local_258 [64];
  undefined1 *local_218;
  Array4<double> local_210;
  Array4<double> *local_1d0;
  undefined1 local_1c8 [64];
  undefined1 *local_188;
  Real *local_180;
  int local_144;
  Real local_140;
  Real local_138;
  int local_12c;
  Real local_128;
  Real local_120;
  int local_114;
  Real local_110;
  Real local_108;
  char *local_100;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  undefined8 *local_b0;
  EBCellFlag *local_a8;
  Dim3 local_a0;
  undefined8 *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  int local_80;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined8 *local_58;
  Dim3 local_50;
  undefined8 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  int *local_8;
  
  local_180 = CoordSys::CellSize(in_stack_00000028);
  local_108 = *local_180;
  local_110 = local_180[1];
  local_114 = 2;
  __x = (int)in_stack_00000028;
  std::abs(__x);
  dVar2 = std::numeric_limits<double>::epsilon();
  std::abs(__x);
  bVar1 = true;
  if (dVar2 * extraout_XMM0_Qa_00 * (double)local_114 < extraout_XMM0_Qa) {
    std::abs(__x);
    dVar2 = std::numeric_limits<double>::min();
    bVar1 = extraout_XMM0_Qa_01 < dVar2;
  }
  if (bVar1) {
    local_120 = *local_180;
    local_128 = local_180[2];
    local_12c = 2;
    std::abs(__x);
    dVar2 = std::numeric_limits<double>::epsilon();
    std::abs(__x);
    bVar1 = true;
    if (dVar2 * extraout_XMM0_Qa_03 * (double)local_12c < extraout_XMM0_Qa_02) {
      std::abs(__x);
      dVar2 = std::numeric_limits<double>::min();
      bVar1 = extraout_XMM0_Qa_04 < dVar2;
    }
    if (bVar1) {
      local_138 = local_180[1];
      local_140 = local_180[2];
      local_144 = 2;
      std::abs(__x);
      dVar2 = std::numeric_limits<double>::epsilon();
      std::abs(__x);
      bVar1 = true;
      if (dVar2 * extraout_XMM0_Qa_06 * (double)local_144 < extraout_XMM0_Qa_05) {
        std::abs(__x);
        dVar2 = std::numeric_limits<double>::min();
        bVar1 = extraout_XMM0_Qa_07 < dVar2;
      }
      if (bVar1) goto LAB_01189fd9;
    }
  }
  local_100 = "apply_eb_redistribution(): grid spacing must be uniform";
  Abort_host(in_stack_fffffffffffffc50);
LAB_01189fd9:
  puVar3 = local_1c8;
  FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
            (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  local_188 = puVar3;
  FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
            (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  local_1d0 = &local_210;
  FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
            (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  local_a8 = *(EBCellFlag **)(in_stack_00000010 + 0x10);
  local_b0 = (undefined8 *)(in_stack_00000010 + 0x18);
  local_b4 = *(int *)(in_stack_00000010 + 0x34);
  local_5c = 0;
  local_88 = *(undefined4 *)local_b0;
  local_6c = 1;
  uStack_84 = *(undefined4 *)(in_stack_00000010 + 0x1c);
  local_d0._0_8_ = *local_b0;
  local_7c = 2;
  local_d0.z = *(int *)(in_stack_00000010 + 0x20);
  local_8 = (int *)(in_stack_00000010 + 0x24);
  local_c = 0;
  local_38 = *local_8 + 1;
  local_18 = in_stack_00000010 + 0x24;
  local_1c = 1;
  iStack_34 = *(int *)(in_stack_00000010 + 0x28) + 1;
  local_28 = in_stack_00000010 + 0x24;
  local_2c = 2;
  local_f0.z = *(int *)(in_stack_00000010 + 0x2c) + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_218 = local_258;
  local_dc._0_8_ = local_f0._0_8_;
  local_dc.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<const_amrex::EBCellFlag>::Array4(&local_2a0,local_a8,&local_c0,&local_dc,local_b4);
  local_260 = &local_2a0;
  FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
            (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  local_2a8 = local_2e8;
  Array4<const_double>::Array4<const_double,_0>(&local_328,local_1d0);
  apply_flux_redistribution
            (in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_00000138,
             in_stack_00000134,in_stack_00000130,in_stack_00000b40,in_stack_00000b48,
             in_stack_00000b50);
  return;
}

Assistant:

void apply_eb_redistribution ( const Box& bx,
                                   MultiFab& div_mf,
                                   MultiFab& divc_mf,
                                   const MultiFab& weights,
                                   MFIter* mfi,
                                   const int icomp,
                                   const int ncomp,
                                   const EBCellFlagFab& flags_fab,
                                   const MultiFab* volfrac,
                                   Box& /*domain*/,
                                   const Geometry & geom)
    {
        //
        // Check that grid is uniform
        //
        const Real* dx = geom.CellSize();

#if (AMREX_SPACEDIM == 2)
        if (! amrex::almostEqual(dx[0], dx[1]))
            amrex::Abort("apply_eb_redistribution(): grid spacing must be uniform");
#elif (AMREX_SPACEDIM == 3)
        if( ! amrex::almostEqual(dx[0],dx[1]) ||
            ! amrex::almostEqual(dx[0],dx[2]) ||
            ! amrex::almostEqual(dx[1],dx[2]) )
            amrex::Abort("apply_eb_redistribution(): grid spacing must be uniform");
#endif

        //
        // Get array4 from arguments
        //
        Array4<Real> const& div  = div_mf.array(*mfi);
        Array4<Real> const& divc = divc_mf.array(*mfi);
        auto const&         wt   = weights.array(*mfi);
        auto const&        flags = flags_fab.array();
        auto const&        vfrac = volfrac->array(*mfi);

        apply_flux_redistribution ( bx, div, divc, wt, icomp, ncomp, flags, vfrac, geom);
    }